

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::EnumValueDescriptorProto::_InternalParse
          (EnumValueDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  uint uVar5;
  EnumValueOptions *pEVar6;
  char cVar7;
  uint tag;
  uint32 uVar8;
  Arena *pAVar9;
  uint uVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  pair<const_char_*,_bool> pVar13;
  
  this_00 = &this->name_;
  uVar10 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar13._8_8_ = 0;
      pVar13.first = ptr;
    }
    else {
      pVar13._8_8_ = 1;
      pVar13.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar13 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar13.first;
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_00344e97;
    bVar1 = *ptr;
    pVar11.second._0_1_ = bVar1;
    pVar11.first = (char *)((byte *)ptr + 1);
    pVar11._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar11 = internal::ReadTagFallback(ptr,uVar8);
      }
      else {
        pVar11.second = uVar8;
        pVar11.first = (char *)((byte *)ptr + 2);
        pVar11._12_4_ = 0;
      }
    }
    ptr = pVar11.first;
    if ((byte *)ptr == (byte *)0x0) {
      cVar7 = '\x04';
    }
    else {
      tag = pVar11.second;
      uVar5 = (uint)(pVar11._8_8_ >> 3) & 0x1fffffff;
      cVar7 = (char)pVar11.second;
      if (uVar5 == 3) {
        if (cVar7 != '\x1a') goto LAB_00344dd1;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if (this->options_ == (EnumValueOptions *)0x0) {
          pAVar9 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar9 & 1) != 0) {
            pAVar9 = *(Arena **)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x18);
          }
          pEVar6 = Arena::CreateMaybeMessage<google::protobuf::EnumValueOptions>(pAVar9);
          this->options_ = pEVar6;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumValueOptions>
                        (ctx,this->options_,ptr);
      }
      else {
        if (uVar5 == 2) {
          if (cVar7 == '\x10') {
            bVar1 = *ptr;
            auVar3._8_8_ = (long)(char)bVar1;
            auVar3._0_8_ = (byte *)ptr + 1;
            auVar4 = auVar3._0_12_;
            if ((long)(char)bVar1 < 0) {
              bVar2 = ((byte *)ptr)[1];
              uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
              if ((char)bVar2 < '\0') {
                pVar12 = internal::VarintParseSlow64(ptr,uVar8);
                auVar4 = pVar12._0_12_;
              }
              else {
                auVar4._8_4_ = uVar8;
                auVar4._0_8_ = (byte *)ptr + 2;
              }
            }
            ptr = auVar4._0_8_;
            uVar10 = 4;
            this->number_ = auVar4._8_4_;
            cVar7 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
            goto LAB_00344e37;
          }
        }
        else if ((uVar5 == 1) && (cVar7 == '\n')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pAVar9 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar9 & 1) != 0) {
            pAVar9 = *(Arena **)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x18);
          }
          if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_00,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          ptr = internal::InlineGreedyStringParser(this_00->ptr_,ptr,ctx);
          goto LAB_00344e02;
        }
LAB_00344dd1:
        if (tag == 0 || (tag & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
          cVar7 = '\a';
          goto LAB_00344e37;
        }
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
      }
LAB_00344e02:
      cVar7 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
    }
LAB_00344e37:
  } while (cVar7 == '\x02');
  if (cVar7 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_00344e97:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar10;
  return (char *)(byte *)ptr;
}

Assistant:

const char* EnumValueDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.EnumValueDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 number = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_number(&has_bits);
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.EnumValueOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}